

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O3

bool NurbsCurveArc(ON_Arc *arc,int dim,ON_NurbsCurve *nurb)

{
  bool bVar1;
  bool bVar2;
  ON_3dPoint *pOVar3;
  double *pdVar4;
  ON_4dPoint *pOVar5;
  double *pdVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double i;
  ON_3dPoint end_point;
  double knot [10];
  ON_3dPoint start_point;
  ON_Interval dom;
  ON_4dPoint CV [9];
  double local_230;
  double local_228;
  undefined8 uStack_220;
  double local_210;
  double local_208;
  double dStack_200;
  ON_3dPoint local_1f8;
  ON_3dPoint local_1d8;
  double local_1c0 [8];
  ON_3dPoint local_180;
  ON_Interval local_168;
  ON_4dPoint local_158;
  ON_4dPoint local_138;
  ON_4dPoint local_118;
  ON_4dPoint local_f8;
  ON_4dPoint local_d8;
  ON_4dPoint local_b8;
  ON_4dPoint local_98;
  ON_4dPoint local_78;
  ON_4dPoint local_58;
  
  bVar1 = ON_Arc::IsValid(arc);
  if (bVar1) {
    pOVar3 = ON_Circle::Center(&arc->super_ON_Circle);
    local_208 = pOVar3->x;
    dStack_200 = pOVar3->y;
    local_228 = pOVar3->z;
    dVar12 = ON_Arc::AngleRadians(arc);
    local_168 = ON_Arc::DomainRadians(arc);
    pdVar4 = ON_Interval::operator[](&local_168,0);
    dVar15 = *pdVar4;
    pdVar4 = ON_Interval::operator[](&local_168,1);
    local_210 = *pdVar4;
    ON_Arc::StartPoint(&local_180,arc);
    bVar2 = ON_Arc::IsCircle(arc);
    if (bVar2) {
      local_1f8.z = local_180.z;
      local_1f8.x = local_180.x;
      local_1f8.y = local_180.y;
    }
    else {
      ON_Arc::EndPoint(&local_1f8,arc);
    }
    if (dVar12 <= 1.570796373608275) {
      ON_4dPoint::operator=(&local_158,&local_180);
      ON_Circle::PointAt(&local_1d8,&arc->super_ON_Circle,dVar12 * 0.5 + dVar15);
      ON_4dPoint::operator=(&local_138,&local_1d8);
      ON_4dPoint::operator=(&local_118,&local_1f8);
      uVar9 = 2;
      uVar10 = 3;
      dVar13 = dVar12;
    }
    else {
      ON_4dPoint::operator=(&local_158,&local_180);
      if (dVar12 <= 3.14159274721655) {
        ON_Circle::PointAt(&local_1d8,&arc->super_ON_Circle,dVar12 * 0.25 + dVar15);
        ON_4dPoint::operator=(&local_138,&local_1d8);
        dVar13 = dVar12 * 0.5;
        ON_Circle::PointAt(&local_1d8,&arc->super_ON_Circle,dVar13 + dVar15);
        ON_4dPoint::operator=(&local_118,&local_1d8);
        ON_Circle::PointAt(&local_1d8,&arc->super_ON_Circle,dVar12 * 0.75 + dVar15);
        ON_4dPoint::operator=(&local_f8,&local_1d8);
        ON_4dPoint::operator=(&local_d8,&local_1f8);
        uVar9 = 4;
        uVar10 = 5;
      }
      else {
        ON_Circle::PointAt(&local_1d8,&arc->super_ON_Circle,dVar12 * 0.125 + dVar15);
        ON_4dPoint::operator=(&local_138,&local_1d8);
        dVar13 = dVar12 * 0.25;
        ON_Circle::PointAt(&local_1d8,&arc->super_ON_Circle,dVar13 + dVar15);
        ON_4dPoint::operator=(&local_118,&local_1d8);
        ON_Circle::PointAt(&local_1d8,&arc->super_ON_Circle,dVar12 * 0.375 + dVar15);
        ON_4dPoint::operator=(&local_f8,&local_1d8);
        ON_Circle::PointAt(&local_1d8,&arc->super_ON_Circle,dVar12 * 0.5 + dVar15);
        ON_4dPoint::operator=(&local_d8,&local_1d8);
        ON_Circle::PointAt(&local_1d8,&arc->super_ON_Circle,dVar12 * 0.625 + dVar15);
        ON_4dPoint::operator=(&local_b8,&local_1d8);
        ON_Circle::PointAt(&local_1d8,&arc->super_ON_Circle,dVar12 * 0.75 + dVar15);
        ON_4dPoint::operator=(&local_98,&local_1d8);
        ON_Circle::PointAt(&local_1d8,&arc->super_ON_Circle,dVar12 * 0.875 + dVar15);
        ON_4dPoint::operator=(&local_78,&local_1d8);
        ON_4dPoint::operator=(&local_58,&local_1f8);
        uVar9 = 8;
        uVar10 = 9;
      }
    }
    dVar12 = cos(dVar13 * 0.5);
    dVar14 = dVar12 + -1.0;
    local_1d8.y = dVar15;
    local_1d8.x = dVar15;
    uVar7 = 1;
    pOVar5 = &local_138;
    do {
      pOVar5->x = pOVar5->x + dVar14 * local_208;
      pOVar5->y = pOVar5->y + dVar14 * dStack_200;
      pOVar5->z = pOVar5->z + dVar14 * local_228;
      pOVar5->w = dVar12;
      pOVar5[1].w = 1.0;
      dVar15 = dVar15 + dVar13;
      local_1c0[uVar7 - 1] = dVar15;
      local_1c0[uVar7 - 2] = dVar15;
      uVar7 = uVar7 + 2;
      pOVar5 = pOVar5 + 2;
    } while (uVar7 < uVar9);
    local_208 = (double)CONCAT44(local_208._4_4_,uVar10);
    (&local_1d8.x)[uVar10] = local_210;
    (&local_1d8.x)[uVar9] = local_210;
    uVar7 = 1;
    pOVar5 = &local_138;
    do {
      dVar15 = pOVar5->w;
      dVar13 = 1.0 / dVar15;
      local_228 = pOVar5->x * dVar13;
      uStack_220 = 0;
      dVar12 = modf(local_228 * 128.0,&local_230);
      dVar12 = (double)(~-(ulong)(dVar12 == 0.0) &
                        (~-(ulong)(2.2737367544323206e-13 < ABS(dVar12)) &
                         (ulong)(local_230 * 0.0078125) |
                        -(ulong)(2.2737367544323206e-13 < ABS(dVar12)) & (ulong)local_228) |
                       -(ulong)(dVar12 == 0.0) & (ulong)local_228);
      if ((local_228 != dVar12) || (NAN(local_228) || NAN(dVar12))) {
        pOVar5->x = dVar12 * dVar15;
      }
      local_228 = pOVar5->y * dVar13;
      uStack_220 = 0;
      dVar12 = modf(local_228 * 128.0,&local_230);
      dVar12 = (double)(~-(ulong)(dVar12 == 0.0) &
                        (~-(ulong)(2.2737367544323206e-13 < ABS(dVar12)) &
                         (ulong)(local_230 * 0.0078125) |
                        -(ulong)(2.2737367544323206e-13 < ABS(dVar12)) & (ulong)local_228) |
                       -(ulong)(dVar12 == 0.0) & (ulong)local_228);
      if ((local_228 != dVar12) || (NAN(local_228) || NAN(dVar12))) {
        pOVar5->y = dVar12 * dVar15;
      }
      dVar13 = dVar13 * pOVar5->z;
      dVar12 = modf(dVar13 * 128.0,&local_230);
      dVar12 = (double)(~-(ulong)(dVar12 == 0.0) &
                        (~-(ulong)(2.2737367544323206e-13 < ABS(dVar12)) &
                         (ulong)(local_230 * 0.0078125) |
                        -(ulong)(2.2737367544323206e-13 < ABS(dVar12)) & (ulong)dVar13) |
                       -(ulong)(dVar12 == 0.0) & (ulong)dVar13);
      if ((dVar13 != dVar12) || (NAN(dVar13) || NAN(dVar12))) {
        pOVar5->z = dVar15 * dVar12;
      }
      uVar7 = uVar7 + 2;
      pOVar5 = pOVar5 + 2;
    } while (uVar7 < uVar9);
    iVar8 = 4 - (uint)(dim == 2);
    nurb->m_dim = dim == 2 ^ 3;
    nurb->m_is_rat = 1;
    nurb->m_order = 3;
    nurb->m_cv_count = local_208._0_4_;
    nurb->m_cv_stride = iVar8;
    ON_NurbsCurve::ReserveCVCapacity(nurb,iVar8 * local_208._0_4_);
    ON_NurbsCurve::ReserveKnotCapacity(nurb,(int)uVar9 + 2);
    pdVar4 = &local_158.w;
    lVar11 = 0;
    do {
      pdVar6 = ON_NurbsCurve::CV(nurb,(int)lVar11);
      *pdVar6 = ((ON_4dPoint *)(pdVar4 + -3))->x;
      pdVar6[1] = pdVar4[-2];
      if (dim == 2) {
        pdVar6[2] = *pdVar4;
      }
      else {
        pdVar6[2] = pdVar4[-1];
        pdVar6[3] = *pdVar4;
      }
      pdVar6 = nurb->m_knot;
      pdVar6[lVar11] = (&local_1d8.x)[lVar11];
      lVar11 = lVar11 + 1;
      pdVar4 = pdVar4 + 4;
    } while (uVar9 + 1 != lVar11);
    pdVar6[uVar10] = local_210;
  }
  return bVar1;
}

Assistant:

static bool NurbsCurveArc ( const ON_Arc& arc, int dim, ON_NurbsCurve& nurb )
{ 
  if ( !arc.IsValid() )
    return false;
  // makes a quadratic nurbs arc
  const ON_3dPoint center = arc.Center();
  double angle = arc.AngleRadians();
  ON_Interval dom = arc.DomainRadians();
  const double angle0 = dom[0];
  const double angle1 = dom[1];
  ON_3dPoint start_point = arc.StartPoint();
  //ON_3dPoint mid_point   = arc.PointAt(angle0 + 0.5*angle);
  ON_3dPoint end_point   = arc.IsCircle() ? start_point : arc.EndPoint();

  ON_4dPoint CV[9];
  double knot[10];

	double a, b, c, w, winv;
	double *cv;
	int    j, span_count, cv_count;

	a = (0.5 + ON_SQRT_EPSILON)*ON_PI;

	if (angle <= a)
		span_count = 1;
	else if (angle <= 2.0*a)
		span_count = 2;
	else if (angle <= 3.0*a)
		span_count = 4; // TODO - make a 3 span case
	else
		span_count = 4;

	cv_count = 2*span_count + 1;
	
	switch(span_count) {
	case 1:
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.50*angle);
    CV[2] = end_point;
		break;
	case 2:
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.25*angle);
    CV[2] = arc.PointAt(angle0 + 0.50*angle);
    CV[3] = arc.PointAt(angle0 + 0.75*angle);
    CV[4] = end_point;
		angle *= 0.5;
		break;
	default: // 4 spans
    CV[0] = start_point;
    CV[1] = arc.PointAt(angle0 + 0.125*angle);
    CV[2] = arc.PointAt(angle0 + 0.250*angle);
    CV[3] = arc.PointAt(angle0 + 0.375*angle);
    CV[4] = arc.PointAt(angle0 + 0.500*angle);
    CV[5] = arc.PointAt(angle0 + 0.625*angle);
    CV[6] = arc.PointAt(angle0 + 0.750*angle);
    CV[7] = arc.PointAt(angle0 + 0.875*angle);
    CV[8] = end_point;
		angle *= 0.25;
		break;
	}

	a = cos(0.5*angle);
	b = a - 1.0;
	//c = (radius > 0.0) ? radius*angle : angle;
  c = angle;

	span_count *= 2;
	knot[0] = knot[1] = angle0; //0.0;
	for (j = 1; j < span_count; j += 2) {
    CV[j].x += b * center.x;
    CV[j].y += b * center.y;
    CV[j].z += b * center.z;
    CV[j].w = a;
		CV[j+1].w = 1.0;
		knot[j+1] = knot[j+2] = knot[j-1] + c;
	}
  knot[cv_count-1] = knot[cv_count] = angle1;
  for ( j = 1; j < span_count; j += 2 ) {
    w = CV[j].w;
    winv = 1.0/w;
    a = CV[j].x*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].x = b*w;
    }
    a = CV[j].y*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].y = b*w;
    }
    a = CV[j].z*winv;
    b = ArcDeFuzz(a);
    if ( a != b ) {
      CV[j].z = b*w;
    }
  }

  nurb.m_dim = (dim==2) ? 2 : 3;
  nurb.m_is_rat = 1;
  nurb.m_order = 3;
  nurb.m_cv_count = cv_count;
  nurb.m_cv_stride = (dim==2 ? 3 : 4);
  nurb.ReserveCVCapacity( nurb.m_cv_stride*cv_count );
  nurb.ReserveKnotCapacity( cv_count+1 );
  for ( j = 0; j < cv_count; j++ ) {
    cv = nurb.CV(j);
    cv[0] = CV[j].x;
    cv[1] = CV[j].y;
    if ( dim == 2 ) {
      cv[2] = CV[j].w;
    }
    else {
      cv[2] = CV[j].z;
      cv[3] = CV[j].w;
    }
    nurb.m_knot[j] = knot[j];
  }
  nurb.m_knot[cv_count] = knot[cv_count];
  return true;
}